

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::GeneratorContext::GetCompilerVersion
          (GeneratorContext *this,Version *version)

{
  uint32_t *puVar1;
  Arena *pAVar2;
  Version *version_local;
  GeneratorContext *this_local;
  
  Version::set_major(version,3);
  Version::set_minor(version,0x13);
  Version::set_patch(version,0);
  puVar1 = internal::HasBits<1UL>::operator[](&version->_has_bits_,0);
  *puVar1 = *puVar1 | 1;
  pAVar2 = MessageLite::GetArenaForAllocation((MessageLite *)version);
  internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&version->suffix_,"",pAVar2);
  return;
}

Assistant:

void GeneratorContext::GetCompilerVersion(Version* version) const {
  version->set_major(GOOGLE_PROTOBUF_VERSION / 1000000);
  version->set_minor(GOOGLE_PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(GOOGLE_PROTOBUF_VERSION % 1000);
  version->set_suffix(GOOGLE_PROTOBUF_VERSION_SUFFIX);
}